

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void CTcTokenizer::log_pedantic(int errnum,...)

{
  char in_AL;
  undefined8 in_RCX;
  __va_list_tag *in_RDX;
  long in_R8;
  CTcTokFileDesc *in_R9;
  CTcMain *in_XMM0_Qa;
  va_list marker;
  CTcMain *in_stack_ffffffffffffff58;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff58 = in_XMM0_Qa;
  }
  get_last_desc(G_tok);
  get_last_linenum(G_tok);
  CTcMain::v_log_error
            (in_stack_ffffffffffffff58,in_R9,in_R8,(tc_severity_t)((ulong)in_RCX >> 0x20),
             (int)in_RCX,in_RDX);
  return;
}

Assistant:

void CTcTokenizer::log_pedantic(int errnum, ...)
{
    va_list marker;

    /* display the message */
    va_start(marker, errnum);
    G_tcmain->v_log_error(G_tok->get_last_desc(), G_tok->get_last_linenum(),
                          TC_SEV_PEDANTIC, errnum, marker);
    va_end(marker);
}